

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O3

void __thiscall SQCompilation::CommaExpr::addExpression(CommaExpr *this,Expr *expr)

{
  uint uVar1;
  Expr **__dest;
  ulong uVar2;
  
  uVar1 = (this->_exprs)._size;
  uVar2 = (ulong)(uVar1 != 0);
  (&(this->super_Expr).super_Node._coordinates.lineStart)[uVar2 * 2] =
       (&(expr->super_Node)._coordinates.lineStart)[uVar2 * 2];
  (&(this->super_Expr).super_Node._coordinates.columnStart)[uVar2 * 2] =
       (&(expr->super_Node)._coordinates.columnStart)[uVar2 * 2];
  if (uVar1 < (this->_exprs)._allocated) {
    __dest = (this->_exprs)._vals;
  }
  else {
    uVar2 = 4;
    if (uVar1 * 2 != 0) {
      uVar2 = (ulong)(uVar1 * 2);
    }
    __dest = (Expr **)Arena::allocate((this->_exprs)._arena,uVar2 * 8);
    memcpy(__dest,(this->_exprs)._vals,(ulong)(this->_exprs)._size << 3);
    (this->_exprs)._vals = __dest;
    (this->_exprs)._allocated = (size_type_conflict)uVar2;
    uVar1 = (this->_exprs)._size;
  }
  (this->_exprs)._size = uVar1 + 1;
  __dest[uVar1] = expr;
  return;
}

Assistant:

void addExpression(Expr *expr) {
      if (_exprs.empty()) {
        setLineStartPos(expr->lineStart());
        setColumnStartPos(expr->columnStart());
      }
      else {
        setLineEndPos(expr->lineEnd());
        setColumnEndPos(expr->columnEnd());
      }

      _exprs.push_back(expr);
    }